

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void punpckhdq_(PDISASM pMyDisasm)

{
  char *pcVar1;
  
  if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    (pMyDisasm->Instruction).Category = 0x70000;
    pcVar1 = (pMyDisasm->Instruction).Mnemonic;
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      builtin_strncpy(pcVar1,"vpunpckhdq",0xb);
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
      }
      ArgsVEX(pMyDisasm);
      return;
    }
    builtin_strncpy(pcVar1,"punpckhdq",10);
    (pMyDisasm->Reserved_).MemDecoration = 0x6d;
    (pMyDisasm->Reserved_).Register_ = 4;
  }
  else {
    if (((pMyDisasm->Reserved_).PrefRepe == 1) || ((pMyDisasm->Reserved_).PrefRepne == 1)) {
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
      (pMyDisasm->Operand1).AccessMode = 0;
      (pMyDisasm->Operand2).AccessMode = 0;
      (pMyDisasm->Operand3).AccessMode = 0;
      (pMyDisasm->Operand4).AccessMode = 0;
      (pMyDisasm->Operand5).AccessMode = 0;
      (pMyDisasm->Operand6).AccessMode = 0;
      (pMyDisasm->Operand7).AccessMode = 0;
      (pMyDisasm->Operand8).AccessMode = 0;
      (pMyDisasm->Operand9).AccessMode = 0;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
      return;
    }
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
    (pMyDisasm->Instruction).Category = 0x50000;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"punpckhdq",10);
    (pMyDisasm->Reserved_).Register_ = 2;
  }
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  (pMyDisasm->Operand1).AccessMode = 3;
  return;
}

Assistant:

void __bea_callspec__ punpckhdq_(PDISASM pMyDisasm)
{
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       pMyDisasm->Instruction.Category = SSSE3_INSTRUCTION;
       if (GV.VEX.state == InUsePrefix) {
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpunpckhdq");
         #endif
         if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
         ArgsVEX(pMyDisasm);
       } else {
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "punpckhdq");
         #endif
         GV.MemDecoration = Arg2_m128_xmm;
         GV.Register_ = SSE_REG;
         GxEx(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;

       }
   }
   else {
     if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
       GV.MemDecoration = Arg2qword;
       pMyDisasm->Instruction.Category = SSE2_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "punpckhdq");
       #endif
       GV.Register_ = MMX_REG;
       GxEx(pMyDisasm);
       pMyDisasm->Operand1.AccessMode = READ + WRITE;

   }
}